

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O3

Vector3f __thiscall Texture::get(Texture *this,Vector2f *x)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  float fVar5;
  Vector2f *x_00;
  undefined1 auVar6 [16];
  ulong uVar7;
  float *pfVar8;
  Vector2f *in_RDX;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined8 in_XMM0_Qa;
  undefined1 auVar12 [16];
  float in_XMM1_Da;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_ZMM2 [64];
  Vector3f VVar15;
  Vector3f VVar16;
  Vector3f g_2;
  Vector3f g_1;
  Vector3f g;
  Vector3f local_108;
  Vector3f local_fc;
  Vector3f local_f0;
  Vector3f local_e4;
  undefined1 local_d8 [16];
  Texture *local_c0;
  Vector2f local_b8;
  Vector3f local_b0;
  Vector3f local_a4;
  Vector3f local_98;
  undefined1 local_8c [8];
  Vector3f local_84;
  Vector3f local_78;
  Vector3f local_6c;
  Vector3f local_60;
  Vector3f local_54;
  Vector3f local_48;
  Vector3f local_3c;
  undefined8 uVar17;
  float fVar18;
  
  auVar14 = in_ZMM2._0_16_;
  if (x->m_elements[0] == 2.8026e-45) {
    local_c0 = this;
    pfVar8 = Vector2f::operator[](in_RDX,0);
    fVar2 = *pfVar8;
    pfVar8 = Vector2f::operator[](in_RDX,0);
    fVar5 = x[8].m_elements[0];
    local_d8 = ZEXT416((uint)*pfVar8);
    pfVar8 = Vector2f::operator[](in_RDX,1);
    auVar11 = vinsertps_avx(ZEXT416((uint)*pfVar8),ZEXT416((uint)fVar2),0x10);
    pfVar8 = Vector2f::operator[](in_RDX,1);
    auVar6 = vpcmpeqd_avx(auVar14,auVar14);
    auVar14 = vinsertps_avx(ZEXT416((uint)*pfVar8),ZEXT416((uint)local_d8._0_4_),0x10);
    auVar14 = vroundps_avx(auVar14,9);
    auVar14 = vsubps_avx(auVar11,auVar14);
    uVar7 = vcmpps_avx512vl(auVar14,ZEXT816(0) << 0x20,5);
    auVar11._8_4_ = 0x3f800000;
    auVar11._0_8_ = 0x3f8000003f800000;
    auVar11._12_4_ = 0x3f800000;
    auVar11 = vminps_avx512vl(auVar11,auVar14);
    auVar14 = vpinsrd_avx(ZEXT416((uint)x[8].m_elements[1]),fVar5,1);
    auVar14 = vpaddd_avx(auVar14,auVar6);
    auVar14 = vcvtdq2ps_avx(auVar14);
    auVar12._0_4_ = (float)((uint)((byte)uVar7 & 1) * auVar11._0_4_) * auVar14._0_4_;
    auVar12._4_4_ = (float)((uint)((byte)(uVar7 >> 1) & 1) * auVar11._4_4_) * auVar14._4_4_;
    auVar12._8_4_ = (float)((uint)((byte)(uVar7 >> 2) & 1) * auVar11._8_4_) * auVar14._8_4_;
    auVar12._12_4_ = (float)((uint)((byte)(uVar7 >> 3) & 1) * auVar11._12_4_) * auVar14._12_4_;
    auVar13._0_4_ = (uint)auVar12._0_4_;
    auVar13._4_4_ = (uint)auVar12._4_4_;
    auVar13._8_4_ = (int)auVar12._8_4_;
    auVar13._12_4_ = (int)auVar12._12_4_;
    auVar6 = vmovshdup_avx(auVar12);
    auVar11 = vpshufd_avx(auVar13,0x55);
    auVar14 = vcvtdq2ps_avx(auVar13);
    auVar11 = vcvtdq2ps_avx(auVar11);
    fVar2 = auVar6._0_4_ - auVar11._0_4_;
    local_d8._0_4_ = auVar12._0_4_ - auVar14._0_4_;
    if ((((int)auVar13._0_4_ < (int)x[8].m_elements[1]) &&
        (-1 < (int)(auVar13._0_4_ | auVar13._4_4_))) &&
       ((int)auVar13._4_4_ < (int)x[8].m_elements[0])) {
      Vector3f::Vector3f(&local_e4,0.0);
      if (*(long *)x[10].m_elements == 0) {
        lVar10 = 0;
        do {
          fVar5 = *(float *)(*(long *)x[0xb].m_elements +
                            ((int)(((int)x[8].m_elements[1] * auVar13._4_4_ + auVar13._0_4_) *
                                  (int)x[9].m_elements[0]) + lVar10) * 4);
          pfVar8 = Vector3f::operator[](&local_e4,(int)lVar10);
          lVar10 = lVar10 + 1;
          *pfVar8 = fVar5;
        } while ((int)lVar10 != 3);
      }
      else {
        lVar10 = 0;
        do {
          bVar4 = *(byte *)(lVar10 + (long)(int)(((int)x[8].m_elements[0] * auVar13._0_4_ +
                                                 auVar13._4_4_) * (int)x[9].m_elements[0]) +
                                     *(long *)x[10].m_elements);
          pfVar8 = Vector3f::operator[](&local_e4,(int)lVar10);
          lVar10 = lVar10 + 1;
          *pfVar8 = (float)bVar4 / 255.0;
        } while ((int)lVar10 != 3);
      }
    }
    else {
      Vector3f::Vector3f(&local_e4,&Vector3f::ZERO);
    }
    ::operator*(&local_3c,1.0 - fVar2);
    fVar5 = 1.0 - (float)local_d8._0_4_;
    ::operator*(&local_b0,fVar5);
    uVar1 = auVar13._0_4_ + 1;
    if ((((int)(uVar1 | auVar13._4_4_) < 0) || ((int)x[8].m_elements[0] <= (int)auVar13._4_4_)) ||
       ((int)x[8].m_elements[1] <= (int)uVar1)) {
      Vector3f::Vector3f(&local_f0,&Vector3f::ZERO);
    }
    else {
      Vector3f::Vector3f(&local_f0,0.0);
      if (*(long *)x[10].m_elements == 0) {
        lVar10 = 0;
        do {
          fVar3 = *(float *)(*(long *)x[0xb].m_elements +
                            ((int)(((int)x[8].m_elements[1] * auVar13._4_4_ + uVar1) *
                                  (int)x[9].m_elements[0]) + lVar10) * 4);
          pfVar8 = Vector3f::operator[](&local_f0,(int)lVar10);
          lVar10 = lVar10 + 1;
          *pfVar8 = fVar3;
        } while ((int)lVar10 != 3);
      }
      else {
        lVar10 = 0;
        do {
          bVar4 = *(byte *)(lVar10 + (long)(int)(((int)x[8].m_elements[0] * uVar1 + auVar13._4_4_) *
                                                (int)x[9].m_elements[0]) + *(long *)x[10].m_elements
                           );
          pfVar8 = Vector3f::operator[](&local_f0,(int)lVar10);
          lVar10 = lVar10 + 1;
          *pfVar8 = (float)bVar4 / 255.0;
        } while ((int)lVar10 != 3);
      }
    }
    ::operator*(&local_54,1.0 - fVar2);
    ::operator*(&local_48,(float)local_d8._0_4_);
    operator+(&local_b0,&local_48);
    uVar9 = auVar13._4_4_ + 1;
    if ((((int)(uVar9 | auVar13._0_4_) < 0) || ((int)x[8].m_elements[0] <= (int)uVar9)) ||
       ((int)x[8].m_elements[1] <= (int)auVar13._0_4_)) {
      Vector3f::Vector3f(&local_fc,&Vector3f::ZERO);
    }
    else {
      Vector3f::Vector3f(&local_fc,0.0);
      if (*(long *)x[10].m_elements == 0) {
        lVar10 = 0;
        do {
          fVar3 = *(float *)(*(long *)x[0xb].m_elements +
                            ((int)(((int)x[8].m_elements[1] * uVar9 + auVar13._0_4_) *
                                  (int)x[9].m_elements[0]) + lVar10) * 4);
          pfVar8 = Vector3f::operator[](&local_fc,(int)lVar10);
          lVar10 = lVar10 + 1;
          *pfVar8 = fVar3;
        } while ((int)lVar10 != 3);
      }
      else {
        lVar10 = 0;
        do {
          bVar4 = *(byte *)(lVar10 + (long)(int)(((int)x[8].m_elements[0] * auVar13._0_4_ + uVar9) *
                                                (int)x[9].m_elements[0]) + *(long *)x[10].m_elements
                           );
          pfVar8 = Vector3f::operator[](&local_fc,(int)lVar10);
          lVar10 = lVar10 + 1;
          *pfVar8 = (float)bVar4 / 255.0;
        } while ((int)lVar10 != 3);
      }
    }
    ::operator*(&local_6c,fVar2);
    ::operator*(&local_60,fVar5);
    operator+(&local_a4,&local_60);
    if ((((int)(uVar1 | uVar9) < 0) || ((int)x[8].m_elements[0] <= (int)uVar9)) ||
       ((int)x[8].m_elements[1] <= (int)uVar1)) {
      Vector3f::Vector3f(&local_108,&Vector3f::ZERO);
    }
    else {
      Vector3f::Vector3f(&local_108,0.0);
      if (*(long *)x[10].m_elements == 0) {
        lVar10 = 0;
        do {
          fVar5 = *(float *)(*(long *)x[0xb].m_elements +
                            ((int)(((int)x[8].m_elements[1] * uVar9 + uVar1) *
                                  (int)x[9].m_elements[0]) + lVar10) * 4);
          pfVar8 = Vector3f::operator[](&local_108,(int)lVar10);
          lVar10 = lVar10 + 1;
          *pfVar8 = fVar5;
        } while ((int)lVar10 != 3);
      }
      else {
        lVar10 = 0;
        do {
          bVar4 = *(byte *)(lVar10 + (long)(int)(((int)x[8].m_elements[0] * uVar1 + uVar9) *
                                                (int)x[9].m_elements[0]) + *(long *)x[10].m_elements
                           );
          pfVar8 = Vector3f::operator[](&local_108,(int)lVar10);
          lVar10 = lVar10 + 1;
          *pfVar8 = (float)bVar4 / 255.0;
        } while ((int)lVar10 != 3);
      }
    }
    ::operator*(&local_84,fVar2);
    ::operator*(&local_78,(float)local_d8._0_4_);
    VVar15 = operator+(&local_98,&local_78);
  }
  else if (x->m_elements[0] == 1.4013e-45) {
    x_00 = *(Vector2f **)x[1].m_elements;
    Vector2f::Vector2f(&local_b8,in_RDX);
    if (*(long *)x[6].m_elements == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)x[7].m_elements)(local_8c,x + 4,&local_b8);
    VVar15 = get(this,x_00);
  }
  else {
    Vector3f::Vector3f((Vector3f *)this,(Vector3f *)(x + 2));
    VVar15.m_elements[2] = in_XMM1_Da;
    VVar15.m_elements[0] = (float)(int)in_XMM0_Qa;
    VVar15.m_elements[1] = (float)(int)((ulong)in_XMM0_Qa >> 0x20);
  }
  VVar16.m_elements[0] = VVar15.m_elements[0];
  uVar17._4_4_ = VVar15.m_elements[1];
  register0x00001240 = VVar15.m_elements[2];
  return (Vector3f)VVar16.m_elements;
}

Assistant:

Vector3f get(Vector2f x) const
	{
		switch (type)
		{
		case TEXTURE_COLOR: return color;
		case TEXTURE_SCALE:
			/*
			std::cerr << source << "!!\n";
			std::cerr << x[0] << "," << x[1] << "\n";
			std::cerr << scale(x)[0] << "|" << scale(x)[1] << "\n";*/
			return source->get(scale(x));
		case TEXTURE_RECT:
			auto pix = [&](int a, int b) {
				if (a < 0 || b < 0 || a >= image_w || b >= image_h)
					return Vector3f::ZERO;
				Vector3f g;
				if (image_buff_stbi != nullptr) {
					for (int x = 0; x < 3; ++x)
						g[x] = image_buff_stbi[a * image_c + b * image_w * image_c + x] / 255.0;
				}
				else {
					for (int x = 0; x < 3; ++x)
						g[x] = hdr_buff[b * image_c + a * image_h * image_c + x];// 0.8);
				}
				return g;
			};
			float a = clamp(x[0]-floor(x[0])) * (image_w - 1), b = clamp(x[1]-floor(x[1])) * (image_h - 1);
			//return pix(int(a + 0.5), int(b + 0.5));
			int l = a, r = b; float p = a - l, q = b - r;
			return pix(l, r) * (1 - p) * (1 - q) + pix(l, r + 1) * (1 - p) * q + pix(l + 1, r) * p * (1 - q) + pix(l + 1, r + 1) * p * q;
		}
	}